

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::Lookup::reportUndeclared
               (Scope *initialScope,string_view name,SourceRange range,
               bitmask<slang::ast::LookupFlags> flags,bool isHierarchical,LookupResult *result)

{
  SourceRange range_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  DiagCode code_00;
  DiagCode code_01;
  DiagCode code_02;
  DiagCode code_03;
  DiagCode code_04;
  DiagCode code_05;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view lookupName;
  string_view name_00;
  string_view lookupName_00;
  bool bVar1;
  reference ppWVar2;
  Symbol *pSVar3;
  PackageSymbol *pPVar4;
  size_type sVar5;
  SourceLocation in_RCX;
  Diagnostic *in_RDX;
  size_t in_RSI;
  Scope *in_RDI;
  SourceLocation in_R8;
  undefined4 in_R9D;
  byte in_stack_00000008;
  Diagnostic *in_stack_00000010;
  Diagnostic *diag_1;
  DiagCode code;
  Symbol *def;
  Diagnostic *diag;
  PackageSymbol *package;
  WildcardImportSymbol *import;
  iterator __end5;
  iterator __begin5;
  vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
  *__range5;
  WildcardImportData *importData;
  anon_class_32_4_3ecd27ba checkMembers;
  anon_class_16_2_6bb36380 isViable;
  Scope *scope;
  bool usedBeforeDeclared;
  int bestDistance;
  Symbol *closestSym;
  Symbol *actualSym;
  Compilation *comp;
  vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
  *in_stack_fffffffffffffd48;
  DefinitionSymbol *in_stack_fffffffffffffd50;
  SourceLocation in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  DiagCode in_stack_fffffffffffffd64;
  SourceLocation in_stack_fffffffffffffd68;
  LookupResult *this;
  undefined4 in_stack_fffffffffffffd70;
  undefined2 in_stack_fffffffffffffd74;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  SourceLocation SVar6;
  undefined4 in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 uVar7;
  Scope *in_stack_fffffffffffffd88;
  Diagnostic *in_stack_fffffffffffffd90;
  Compilation *in_stack_fffffffffffffd98;
  WildcardImportSymbol *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  anon_class_32_4_3ecd27ba *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  bitmask<slang::ast::LookupFlags> local_188;
  undefined4 local_184;
  size_t local_180;
  Diagnostic *local_178;
  SourceLocation local_170;
  SourceLocation local_168;
  undefined4 local_15c;
  size_t local_158;
  Diagnostic *local_150;
  int *local_148;
  int *local_130;
  SourceLocation local_128;
  undefined4 local_11c;
  size_t local_118;
  Diagnostic *local_110;
  SourceLocation local_108;
  SourceLocation local_100;
  undefined4 local_f4;
  Diagnostic *local_f0;
  bitmask<slang::ast::LookupFlags> local_e4;
  PackageSymbol *local_e0;
  WildcardImportSymbol *local_d8;
  WildcardImportSymbol **local_d0;
  __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
  local_c8;
  WildcardImportData *local_c0;
  WildcardImportData *local_b8;
  undefined1 *local_b0;
  basic_string_view<char,_std::char_traits<char>_> *local_a8;
  int *local_a0;
  long *local_98;
  size_t local_90;
  Diagnostic *in_stack_ffffffffffffff78;
  Compilation *in_stack_ffffffffffffff80;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff8c;
  Scope *pSVar9;
  Scope *local_68;
  bool local_5d;
  int local_5c;
  long local_58;
  Symbol *local_50;
  Compilation *local_48;
  bitmask<slang::ast::LookupResultFlags> local_3d;
  bitmask<slang::ast::LookupFlags> local_3c;
  bitmask<slang::ast::LookupFlags> local_38;
  byte local_31;
  Scope *local_30;
  undefined4 local_24;
  SourceRange local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_31 = in_stack_00000008 & 1;
  local_30 = in_RDI;
  local_24 = in_R9D;
  local_20.startLoc = in_RCX;
  local_20.endLoc = in_R8;
  local_10._M_len = in_RSI;
  local_10._M_str = (char *)in_RDX;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_38,NoUndeclaredError);
  bVar1 = bitmask<slang::ast::LookupFlags>::has
                    ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd50,
                     (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd48);
  uVar7 = true;
  if (!bVar1) {
    bitmask<slang::ast::LookupFlags>::bitmask(&local_3c,NoUndeclaredErrorIfUninstantiated);
    bVar1 = bitmask<slang::ast::LookupFlags>::has
                      ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd50,
                       (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd48);
    in_stack_fffffffffffffd86 = false;
    uVar7 = in_stack_fffffffffffffd86;
    if (bVar1) {
      in_stack_fffffffffffffd86 = Scope::isUninstantiated(in_stack_fffffffffffffd88);
      uVar7 = in_stack_fffffffffffffd86;
    }
  }
  if ((bool)uVar7 == false) {
    SVar6 = (SourceLocation)
            ((long)&(in_stack_00000010->args).
                    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    bitmask<slang::ast::LookupResultFlags>::bitmask(&local_3d,SuppressUndeclared);
    bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                      ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffd50,
                       (bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffd48);
    if (!bVar1) {
      local_48 = Scope::getCompilation(local_30);
      local_50 = (Symbol *)0x0;
      local_58 = 0;
      local_5c = 0x7fffffff;
      local_5d = false;
      local_68 = local_30;
      do {
        uVar8 = local_24;
        pSVar9 = local_30;
        bitmask<slang::ast::LookupFlags>::bitmask
                  ((bitmask<slang::ast::LookupFlags> *)&stack0xffffffffffffff84,AllowDeclaredAfter);
        bVar1 = bitmask<slang::ast::LookupFlags>::has
                          ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd50,
                           (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd48);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_90 = local_10._M_len;
          name_00._M_str._0_4_ = in_stack_fffffffffffffdb8;
          name_00._M_len = (size_t)in_stack_fffffffffffffdb0;
          name_00._M_str._4_4_ = in_stack_fffffffffffffdbc;
          in_stack_ffffffffffffff78 = (Diagnostic *)local_10._M_str;
          local_50 = Scope::find((Scope *)CONCAT44(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8),name_00);
          if (local_50 != (Symbol *)0x0) {
            local_5d = reportUndeclared::anon_class_16_2_6bb36380::operator()
                                 ((anon_class_16_2_6bb36380 *)in_stack_fffffffffffffd88,
                                  (Symbol *)
                                  CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffd86,
                                                          CONCAT24(in_stack_fffffffffffffd84,
                                                                   in_stack_fffffffffffffd80))));
            break;
          }
        }
        bVar1 = Compilation::doTypoCorrection(local_48);
        if (bVar1) {
          local_b0 = &stack0xffffffffffffff88;
          local_a8 = &local_10;
          local_a0 = &local_5c;
          local_98 = &local_58;
          reportUndeclared::anon_class_32_4_3ecd27ba::operator()
                    (in_stack_fffffffffffffdb0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          local_b8 = Scope::getWildcardImportData(local_68);
          if (local_b8 != (WildcardImportData *)0x0) {
            local_c0 = local_b8;
            local_c8._M_current =
                 (WildcardImportSymbol **)
                 std::
                 vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                 ::begin(in_stack_fffffffffffffd48);
            local_d0 = (WildcardImportSymbol **)
                       std::
                       vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                       ::end(in_stack_fffffffffffffd48);
            while (bVar1 = __gnu_cxx::
                           operator==<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                                     ((__normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                                       *)in_stack_fffffffffffffd50,
                                      (__normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                                       *)in_stack_fffffffffffffd48), ((bVar1 ^ 0xffU) & 1) != 0) {
              ppWVar2 = __gnu_cxx::
                        __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                        ::operator*(&local_c8);
              local_d8 = *ppWVar2;
              local_e0 = WildcardImportSymbol::getPackage(in_stack_fffffffffffffda0);
              if (local_e0 != (PackageSymbol *)0x0) {
                reportUndeclared::anon_class_32_4_3ecd27ba::operator()
                          (in_stack_fffffffffffffdb0,
                           (Scope *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              }
              __gnu_cxx::
              __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
              ::operator++(&local_c8);
            }
          }
        }
        pSVar3 = Scope::asSymbol(local_68);
        local_68 = Symbol::getParentScope(pSVar3);
        in_stack_fffffffffffffd77 = true;
        if (local_68 != (Scope *)0x0) {
          pSVar3 = Scope::asSymbol(local_68);
          in_stack_fffffffffffffd76 = false;
          in_stack_fffffffffffffd77 = in_stack_fffffffffffffd76;
          if (pSVar3->kind == CompilationUnit) {
            bitmask<slang::ast::LookupFlags>::bitmask(&local_e4,DisallowUnitReferences);
            in_stack_fffffffffffffd76 =
                 bitmask<slang::ast::LookupFlags>::has
                           ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd50,
                            (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd48);
            in_stack_fffffffffffffd77 = in_stack_fffffffffffffd76;
          }
        }
      } while ((bool)in_stack_fffffffffffffd77 == false);
      if (local_5d == false) {
        local_158 = local_10._M_len;
        local_150 = (Diagnostic *)local_10._M_str;
        lookupName_00._M_len._4_4_ = in_stack_ffffffffffffff8c;
        lookupName_00._M_len._0_4_ = uVar8;
        lookupName_00._M_str = (char *)pSVar9;
        Compilation::tryGetDefinition
                  (in_stack_ffffffffffffff80,lookupName_00,(Scope *)in_stack_ffffffffffffff78);
        local_130 = local_148;
        if ((local_148 == (int *)0x0) || (*local_148 != 2)) {
          lookupName._M_str._0_4_ = in_stack_fffffffffffffda8;
          lookupName._M_len = (size_t)in_stack_fffffffffffffda0;
          lookupName._M_str._4_4_ = in_stack_fffffffffffffdac;
          pPVar4 = Compilation::getPackage(in_stack_fffffffffffffd98,lookupName);
          if (pPVar4 == (PackageSymbol *)0x0) {
            Compilation::didTypoCorrection(local_48);
            if (((local_58 == 0) || (local_5c < 1)) ||
               (sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_10),
               sVar5 / (ulong)(long)local_5c < 3)) {
              code_05.code._0_1_ = in_stack_fffffffffffffd86;
              code_05.subsystem = in_stack_fffffffffffffd84;
              code_05.code._1_1_ = uVar7;
              sourceRange_03.startLoc._4_2_ = in_stack_fffffffffffffd74;
              sourceRange_03.startLoc._0_4_ = in_stack_fffffffffffffd70;
              sourceRange_03.startLoc._6_1_ = in_stack_fffffffffffffd76;
              sourceRange_03.startLoc._7_1_ = in_stack_fffffffffffffd77;
              sourceRange_03.endLoc = SVar6;
              LookupResult::addDiag
                        ((LookupResult *)in_stack_fffffffffffffd68,
                         (Scope *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         code_05,sourceRange_03);
              arg_06._M_str = (char *)local_20.endLoc;
              arg_06._M_len = (size_t)local_20.startLoc;
              Diagnostic::operator<<((Diagnostic *)local_10._M_str,arg_06);
            }
            else {
              code_04.code._0_1_ = in_stack_fffffffffffffd86;
              code_04.subsystem = in_stack_fffffffffffffd84;
              code_04.code._1_1_ = uVar7;
              sourceRange_02.startLoc._4_2_ = in_stack_fffffffffffffd74;
              sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffffd70;
              sourceRange_02.startLoc._6_1_ = in_stack_fffffffffffffd76;
              sourceRange_02.startLoc._7_1_ = in_stack_fffffffffffffd77;
              sourceRange_02.endLoc = SVar6;
              LookupResult::addDiag
                        ((LookupResult *)in_stack_fffffffffffffd68,
                         (Scope *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         code_04,sourceRange_02);
              arg_04._M_str = (char *)in_stack_fffffffffffffda0;
              arg_04._M_len = (size_t)in_stack_fffffffffffffd98;
              Diagnostic::operator<<(in_stack_fffffffffffffd90,arg_04);
              arg_05._M_str = (char *)in_stack_fffffffffffffda0;
              arg_05._M_len = (size_t)in_stack_fffffffffffffd98;
              Diagnostic::operator<<(in_stack_fffffffffffffd90,arg_05);
              Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd64,
                                  in_stack_fffffffffffffd58);
            }
          }
          else {
            SourceRange::end(&local_20);
            code_00.code._0_1_ = in_stack_fffffffffffffd76;
            code_00.subsystem = in_stack_fffffffffffffd74;
            code_00.code._1_1_ = in_stack_fffffffffffffd77;
            LookupResult::addDiag
                      ((LookupResult *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                       ,local_30,code_00,in_stack_fffffffffffffd68);
            arg_03._M_str = (char *)in_stack_fffffffffffffda0;
            arg_03._M_len = (size_t)in_stack_fffffffffffffd98;
            Diagnostic::operator<<(in_stack_fffffffffffffd90,arg_03);
            range_00.endLoc._0_4_ = in_stack_fffffffffffffd60;
            range_00.startLoc = (SourceLocation)local_30;
            range_00.endLoc._4_2_ = in_stack_fffffffffffffd64.subsystem;
            range_00.endLoc._6_2_ = in_stack_fffffffffffffd64.code;
            Diagnostic::operator<<(in_stack_00000010,range_00);
          }
        }
        else if ((local_31 & 1) == 0) {
          bitmask<slang::ast::LookupFlags>::bitmask(&local_188,Type);
          bVar1 = bitmask<slang::ast::LookupFlags>::has
                            ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd50,
                             (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffd48);
          if (bVar1) {
            this = (LookupResult *)&slang::diag::DefinitionUsedAsType;
          }
          else {
            this = (LookupResult *)&slang::diag::DefinitionUsedAsValue;
          }
          local_184 = *(undefined4 *)&this->found;
          code_03.code._0_1_ = in_stack_fffffffffffffd86;
          code_03.subsystem = in_stack_fffffffffffffd84;
          code_03.code._1_1_ = uVar7;
          sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffffd74;
          sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffffd70;
          sourceRange_01.startLoc._6_1_ = in_stack_fffffffffffffd76;
          sourceRange_01.startLoc._7_1_ = in_stack_fffffffffffffd77;
          sourceRange_01.endLoc = SVar6;
          LookupResult::addDiag
                    (this,(Scope *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     code_03,sourceRange_01);
          arg_01._M_str = (char *)in_stack_fffffffffffffda0;
          arg_01._M_len = (size_t)in_stack_fffffffffffffd98;
          Diagnostic::operator<<(in_stack_fffffffffffffd90,arg_01);
          Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x73c7f6);
          DefinitionSymbol::getArticleKindString(in_stack_fffffffffffffd50);
          arg_02._M_str = (char *)in_stack_fffffffffffffda0;
          arg_02._M_len = (size_t)in_stack_fffffffffffffd98;
          Diagnostic::operator<<(in_stack_fffffffffffffd90,arg_02);
        }
        else {
          local_15c = 0x5000a;
          local_170 = local_20.startLoc;
          local_168 = local_20.endLoc;
          code_02.code._0_1_ = in_stack_fffffffffffffd86;
          code_02.subsystem = in_stack_fffffffffffffd84;
          code_02.code._1_1_ = uVar7;
          sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffffd74;
          sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffd70;
          sourceRange_00.startLoc._6_1_ = in_stack_fffffffffffffd76;
          sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffffd77;
          sourceRange_00.endLoc = SVar6;
          LookupResult::addDiag
                    ((LookupResult *)in_stack_fffffffffffffd68,
                     (Scope *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),code_02,
                     sourceRange_00);
          local_180 = local_10._M_len;
          local_178 = (Diagnostic *)local_10._M_str;
          arg_00._M_str = (char *)in_stack_fffffffffffffda0;
          arg_00._M_len = (size_t)in_stack_fffffffffffffd98;
          Diagnostic::operator<<(in_stack_fffffffffffffd90,arg_00);
        }
      }
      else {
        local_f4 = 0x3e000a;
        local_108 = local_20.startLoc;
        local_100 = local_20.endLoc;
        code_01.code._0_1_ = in_stack_fffffffffffffd86;
        code_01.subsystem = in_stack_fffffffffffffd84;
        code_01.code._1_1_ = uVar7;
        sourceRange.startLoc._4_2_ = in_stack_fffffffffffffd74;
        sourceRange.startLoc._0_4_ = in_stack_fffffffffffffd70;
        sourceRange.startLoc._6_1_ = in_stack_fffffffffffffd76;
        sourceRange.startLoc._7_1_ = in_stack_fffffffffffffd77;
        sourceRange.endLoc = SVar6;
        local_f0 = LookupResult::addDiag
                             ((LookupResult *)in_stack_fffffffffffffd68,
                              (Scope *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                              ,code_01,sourceRange);
        local_118 = local_10._M_len;
        local_110 = (Diagnostic *)local_10._M_str;
        arg._M_str = (char *)in_stack_fffffffffffffda0;
        arg._M_len = (size_t)in_stack_fffffffffffffd98;
        Diagnostic::operator<<(in_stack_fffffffffffffd90,arg);
        local_11c = 0x50001;
        local_128 = local_50->location;
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd64,
                            in_stack_fffffffffffffd58);
      }
    }
  }
  return;
}

Assistant:

void Lookup::reportUndeclared(const Scope& initialScope, std::string_view name, SourceRange range,
                              bitmask<LookupFlags> flags, bool isHierarchical,
                              LookupResult& result) {
    // If the caller doesn't want an error, don't give him one.
    if (flags.has(LookupFlags::NoUndeclaredError) ||
        (flags.has(LookupFlags::NoUndeclaredErrorIfUninstantiated) &&
         initialScope.isUninstantiated())) {
        return;
    }

    // If we observed a wildcard import we couldn't resolve, we shouldn't report an
    // error for an undeclared identifier because maybe it's supposed to come from that package.
    // In particular it's important that we do this because when we first look at a
    // definition because it's possible we haven't seen the file containing the package yet.
    // This also gets set for class scopes that have an error base class.
    if (result.flags.has(LookupResultFlags::SuppressUndeclared))
        return;

    // The symbol wasn't found, so this is an error. The only question is how helpful we can
    // make that error. Let's try to find the closest named symbol in all reachable scopes,
    // including package imports, to provide a "did you mean" diagnostic. If along the way
    // we happen to actually find the symbol but it's declared later in the source text,
    // we will use that to issue a "used before declared" diagnostic.
    auto& comp = initialScope.getCompilation();
    const Symbol* actualSym = nullptr;
    const Symbol* closestSym = nullptr;
    int bestDistance = INT_MAX;
    bool usedBeforeDeclared = false;
    auto scope = &initialScope;
    while (true) {
        // This lambda returns true if the given symbol is a viable candidate
        // for the kind of lookup that was being performed.
        auto isViable = [flags, &initialScope](const Symbol& sym) {
            const Symbol* s = &sym;
            if (s->kind == SymbolKind::TransparentMember)
                s = &s->as<TransparentMemberSymbol>().wrapped;

            if (flags.has(LookupFlags::Type)) {
                if (!s->isType() && s->kind != SymbolKind::TypeParameter &&
                    s->kind != SymbolKind::GenericClassDef) {
                    return false;
                }
            }
            else {
                switch (s->kind) {
                    case SymbolKind::Subroutine:
                    case SymbolKind::InstanceArray:
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                    case SymbolKind::Checker:
                    case SymbolKind::UninstantiatedDef:
                        break;
                    case SymbolKind::Instance:
                        if (!s->as<InstanceSymbol>().isInterface())
                            return false;
                        break;
                    default:
                        if (!s->isValue())
                            return false;
                        break;
                }
            }

            // Ignore special members.
            if (s->kind == SymbolKind::Subroutine &&
                s->as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
                return false;
            }

            if (VariableSymbol::isKind(s->kind) &&
                s->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return false;
            }

            if (!isVisibleFrom(*s, initialScope))
                return false;

            return true;
        };

        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            actualSym = scope->find(name);
            if (actualSym) {
                usedBeforeDeclared = isViable(*actualSym);
                break;
            }
        }

        // Only check for typos if that functionality is enabled -- it can be
        // disabled by config or if we've tried too many times to correct typos.
        if (comp.doTypoCorrection()) {
            auto checkMembers = [&](const Scope& toCheck) {
                for (auto& member : toCheck.members()) {
                    if (member.name.empty() || !isViable(member))
                        continue;

                    int dist = editDistance(member.name, name, /* allowReplacements */ true,
                                            bestDistance);
                    if (dist < bestDistance) {
                        closestSym = &member;
                        bestDistance = dist;
                    }
                }
            };

            // Check the current scope.
            checkMembers(*scope);

            // Also search in package imports.
            if (auto importData = scope->getWildcardImportData()) {
                for (auto import : importData->wildcardImports) {
                    auto package = import->getPackage();
                    if (package)
                        checkMembers(*package);
                }
            }
        }

        scope = scope->asSymbol().getParentScope();
        if (!scope || (scope->asSymbol().kind == SymbolKind::CompilationUnit &&
                       flags.has(LookupFlags::DisallowUnitReferences))) {
            break;
        }
    }

    // If we found the actual named symbol and it's viable for our kind of lookup,
    // report a diagnostic about it being used before declared.
    if (usedBeforeDeclared) {
        auto& diag = result.addDiag(initialScope, diag::UsedBeforeDeclared, range);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, actualSym->location);
        return;
    }

    // Otherwise, check if this names a definition, in which case we can give a nicer error.
    if (auto def = comp.tryGetDefinition(name, initialScope).definition;
        def && def->kind == SymbolKind::Definition) {
        if (isHierarchical) {
            result.addDiag(initialScope, diag::CouldNotResolveHierarchicalPath, range) << name;
        }
        else {
            auto code = flags.has(LookupFlags::Type) ? diag::DefinitionUsedAsType
                                                     : diag::DefinitionUsedAsValue;
            result.addDiag(initialScope, code, range)
                << name << def->as<DefinitionSymbol>().getArticleKindString();
        }
        return;
    }

    // Also check for a package with this name.
    if (comp.getPackage(name)) {
        result.addDiag(initialScope, diag::UndeclaredButFoundPackage, range.end()) << name << range;
        return;
    }

    // Count the number of times we've performed typo correction.
    comp.didTypoCorrection();

    // See if we found a viable symbol with a name that's somewhat close to the one we wanted.
    // If we did, assume that the user made a typo and report it.
    if (closestSym && bestDistance > 0 && name.length() / size_t(bestDistance) >= 3) {
        auto& diag = result.addDiag(initialScope, diag::TypoIdentifier, range);
        diag << name << closestSym->name;
        diag.addNote(diag::NoteDeclarationHere, closestSym->location);
        return;
    }

    // We couldn't make any sense of this, just report a simple error about a missing identifier.
    result.addDiag(initialScope, diag::UndeclaredIdentifier, range) << name;
}